

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

unsigned_short __thiscall DivideTest<unsigned_short>::get_random(DivideTest<unsigned_short> *this)

{
  ushort uVar1;
  UT old;
  DivideTest<unsigned_short> *this_local;
  
  this->seed = this->seed * 0x19660d + 0x3c6ef35f;
  uVar1 = this->rand_n;
  this->rand_n = this->rand_n * (((ushort)this->seed & 1) + 1) +
                 (short)((ulong)this->rand_n % 0x1c9c381) + 3;
  if (this->rand_n < uVar1) {
    this->rand_n = (UT)((ulong)this->seed % 0x13);
  }
  return this->rand_n;
}

Assistant:

T get_random() {
        // https://en.wikipedia.org/wiki/Linear_congruential_generator
        seed = seed * 1664525 + 1013904223;

        UT old = rand_n;
        rand_n = rand_n * (seed % 2 + 1) + rand_n % 30000001 + 3;

        // Reset upon integer overflow
        if (rand_n < old) {
            rand_n = seed % 19;
        }

        // The algorithm above generates mostly positive numbers.
        // Hence convert 50% of all values to negative.
        if (limits::is_signed) {
            if (seed % 2) return -(T)rand_n;
        }

        return (T)rand_n;
    }